

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextDocument::undo(QTextDocument *this,QTextCursor *cursor)

{
  QSharedDataPointer<QTextCursorPrivate> QVar1;
  int pos;
  long in_FS_OFFSET;
  QTextCursor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pos = QTextDocumentPrivate::undoRedo(*(QTextDocumentPrivate **)&this->field_0x8,true);
  if (-1 < pos && cursor != (QTextCursor *)0x0) {
    QTextCursor::QTextCursor(&local_30,this);
    QVar1.d.ptr = (totally_ordered_wrapper<QTextCursorPrivate_*>)(cursor->d).d.ptr;
    (cursor->d).d.ptr = (QTextCursorPrivate *)local_30;
    local_30.d.d.ptr =
         (QSharedDataPointer<QTextCursorPrivate>)(QSharedDataPointer<QTextCursorPrivate>)QVar1.d.ptr
    ;
    QTextCursor::~QTextCursor(&local_30);
    QTextCursor::setPosition(cursor,pos,MoveAnchor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::undo(QTextCursor *cursor)
{
    Q_D(QTextDocument);
    const int pos = d->undoRedo(true);
    if (cursor && pos >= 0) {
        *cursor = QTextCursor(this);
        cursor->setPosition(pos);
    }
}